

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_read_file(mbedtls_mpi *X,int radix,FILE *fin)

{
  char *s_00;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char cVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  char s [2484];
  undefined8 uStack_9e0;
  char acStack_9d8 [2488];
  
  uStack_9e0 = 0x105078;
  memset(acStack_9d8,0,0x9b4);
  uStack_9e0 = 0x105088;
  pcVar1 = fgets(acStack_9d8,0x9b3,(FILE *)fin);
  if (pcVar1 == (char *)0x0) {
    iVar6 = -2;
  }
  else {
    uStack_9e0 = 0x105098;
    sVar2 = strlen(acStack_9d8);
    iVar6 = -8;
    if (sVar2 != 0x9b2) {
      sVar4 = sVar2 - 1;
      cVar5 = acStack_9d8[sVar2 - 1];
      if (cVar5 == '\n') {
        acStack_9d8[sVar2 - 1] = '\0';
        sVar3 = sVar2 - 2;
        cVar5 = acStack_9d8[sVar2 - 2];
        sVar2 = sVar4;
        sVar4 = sVar3;
      }
      if (cVar5 == '\r') {
        acStack_9d8[sVar4] = '\0';
        sVar2 = sVar4;
      }
      pcVar1 = acStack_9d8 + sVar2;
      do {
        s_00 = pcVar1;
        pcVar1 = s_00 + -1;
        if (pcVar1 < acStack_9d8) break;
        cVar5 = *pcVar1;
        iVar6 = (int)cVar5;
        uVar7 = (ulong)(iVar6 - 0x30);
        if (9 < (byte)(cVar5 - 0x30U)) {
          uVar7 = 0xff;
        }
        uVar8 = (ulong)(iVar6 - 0x37);
        if (5 < (byte)(cVar5 + 0xbfU)) {
          uVar8 = uVar7;
        }
        uVar7 = (ulong)(iVar6 - 0x57);
        if (5 < (byte)(cVar5 + 0x9fU)) {
          uVar7 = uVar8;
        }
      } while (uVar7 < (ulong)(long)radix);
      uStack_9e0 = 0x105141;
      iVar6 = mbedtls_mpi_read_string(X,radix,s_00);
    }
  }
  return iVar6;
}

Assistant:

int mbedtls_mpi_read_file( mbedtls_mpi *X, int radix, FILE *fin )
{
    mbedtls_mpi_uint d;
    size_t slen;
    char *p;
    /*
     * Buffer should have space for (short) label and decimal formatted MPI,
     * newline characters and '\0'
     */
    char s[ MBEDTLS_MPI_RW_BUFFER_SIZE ];

    memset( s, 0, sizeof( s ) );
    if( fgets( s, sizeof( s ) - 1, fin ) == NULL )
        return( MBEDTLS_ERR_MPI_FILE_IO_ERROR );

    slen = strlen( s );
    if( slen == sizeof( s ) - 2 )
        return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );

    if( s[slen - 1] == '\n' ) { slen--; s[slen] = '\0'; }
    if( s[slen - 1] == '\r' ) { slen--; s[slen] = '\0'; }

    p = s + slen;
    while( --p >= s )
        if( mpi_get_digit( &d, radix, *p ) != 0 )
            break;

    return( mbedtls_mpi_read_string( X, radix, p + 1 ) );
}